

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O0

void boost::unit_test::utils::print_escaped_cdata(ostream *where_to,const_string *value)

{
  int iVar1;
  basic_cstring<const_char> *str;
  size_type pos;
  pointer in_stack_ffffffffffffff98;
  basic_cstring<const_char> *in_stack_ffffffffffffffa0;
  basic_cstring<const_char> *in_stack_ffffffffffffffa8;
  basic_cstring<const_char> *in_stack_ffffffffffffffd0;
  basic_cstring<const_char> *in_stack_ffffffffffffffd8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  
  if (print_escaped_cdata(std::ostream&,boost::unit_test::basic_cstring<char_const>)::cdata_end ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&print_escaped_cdata(std::ostream&,boost::unit_test::basic_cstring<char_const>)
                                 ::cdata_end);
    if (iVar1 != 0) {
      basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      __cxa_guard_release(&print_escaped_cdata(std::ostream&,boost::unit_test::basic_cstring<char_const>)
                           ::cdata_end);
    }
  }
  basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)&stack0xffffffffffffffc8,&print_escaped_cdata::cdata_end);
  str = (basic_cstring<const_char> *)
        basic_cstring<const_char>::find(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (str == (basic_cstring<const_char> *)0xffffffffffffffff) {
    unit_test::operator<<(in_stack_ffffffffffffffe0,(basic_cstring<const_char> *)0xffffffffffffffff)
    ;
  }
  else {
    basic_cstring<const_char>::substr
              (in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0,
               (size_type)in_stack_ffffffffffffff98);
    unit_test::operator<<(in_stack_ffffffffffffffe0,str);
    unit_test::operator<<(in_stack_ffffffffffffffe0,str);
    basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xffffffffffffffa8,"<![CDATA[",9);
    unit_test::operator<<(in_stack_ffffffffffffffe0,str);
    basic_cstring<const_char>::substr
              (in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0,
               (size_type)in_stack_ffffffffffffff98);
    unit_test::operator<<(in_stack_ffffffffffffffe0,str);
  }
  return;
}

Assistant:

inline void
print_escaped_cdata( std::ostream& where_to, const_string value )
{
    static const_string cdata_end( "]]>" );

    const_string::size_type pos = value.find( cdata_end );
    if( pos == const_string::npos )
        where_to << value;
    else {
        where_to << value.substr( 0, pos+2 ) << cdata_end
                 << BOOST_TEST_L( "<![CDATA[" ) << value.substr( pos+2 );
    }
}